

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_acct_resp(connectdata *conn,int ftpcode)

{
  Curl_easy *data;
  CURLcode result;
  int ftpcode_local;
  connectdata *conn_local;
  
  if (ftpcode == 0xe6) {
    data._0_4_ = ftp_state_loggedin(conn);
  }
  else {
    Curl_failf(conn->data,"ACCT rejected by server: %03d",(ulong)(uint)ftpcode);
    data._0_4_ = CURLE_FTP_WEIRD_PASS_REPLY;
  }
  return (CURLcode)data;
}

Assistant:

static CURLcode ftp_state_acct_resp(struct connectdata *conn,
                                    int ftpcode)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  if(ftpcode != 230) {
    failf(data, "ACCT rejected by server: %03d", ftpcode);
    result = CURLE_FTP_WEIRD_PASS_REPLY; /* FIX */
  }
  else
    result = ftp_state_loggedin(conn);

  return result;
}